

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineTemplate.h
# Opt level: O2

void __thiscall
kiste::LineTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp>::
render_text<kiste::line_t>
          (LineTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> *this,line_t *line)

{
  bool *string_opened_00;
  pointer psVar1;
  bool bVar2;
  byte bVar3;
  undefined8 in_RAX;
  size_t i;
  ulong uVar4;
  pointer psVar5;
  bool string_opened;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  for (uVar4 = 0; uVar4 < line->_curly_level; uVar4 = uVar4 + 1) {
    cpp::text(this->_serialize,"  ");
  }
  bVar2 = line_t::starts_with_text(line);
  bVar3 = bVar2 & line->_previous_line_ends_with_text;
  uStack_38 = CONCAT17(bVar3,(undefined7)uStack_38);
  if (bVar3 != 0) {
    cpp::text(this->_serialize,"                ");
  }
  psVar1 = (line->super_line_data_t)._segments.
           super__Vector_base<kiste::segment_t,_std::allocator<kiste::segment_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
  string_opened_00 = (bool *)((long)&uStack_38 + 7);
  for (psVar5 = (line->super_line_data_t)._segments.
                super__Vector_base<kiste::segment_t,_std::allocator<kiste::segment_t>_>._M_impl.
                super__Vector_impl_data._M_start; psVar5 != psVar1; psVar5 = psVar5 + 1) {
    switch(psVar5->_type) {
    case text:
      open_string(this,string_opened_00);
      text_segment(this,&psVar5->_text);
      break;
    case escape:
      close_string(this,string_opened_00);
      escape(this,&psVar5->_text);
      break;
    case raw:
      close_string(this,string_opened_00);
      raw(this,&psVar5->_text);
      break;
    case call:
      close_string(this,string_opened_00);
      call(this,&psVar5->_text);
    }
  }
  if (line->_next_line_starts_with_text == false) {
    close_string(this,(bool *)((long)&uStack_38 + 7));
  }
  cpp::text(this->_serialize,"\n");
  return;
}

Assistant:

void render_text(const Line& line)
    {
      for (std::size_t i = 0; i < line._curly_level; ++i)
      {
      _serialize.text("  ");
      }
      auto string_opened = line.starts_with_text() && line._previous_line_ends_with_text;
      if (string_opened)
      {
      _serialize.text("                ");
      }
      for (const auto& segment : line._segments)
      {
        switch(segment._type)
        {
        case segment_type::cpp:
          break;
        case segment_type::text:
        static_assert(std::is_same<decltype(open_string(string_opened)), void>::value, "$call{} requires void expression"); (open_string(string_opened));
        static_assert(std::is_same<decltype(text_segment(segment._text)), void>::value, "$call{} requires void expression"); (text_segment(segment._text));
          break;
        case segment_type::trim_trailing_return:
          break;
        case segment_type::escape:
        static_assert(std::is_same<decltype(close_string(string_opened)), void>::value, "$call{} requires void expression"); (close_string(string_opened));
        static_assert(std::is_same<decltype(escape(segment._text)), void>::value, "$call{} requires void expression"); (escape(segment._text));
          break;
        case segment_type::call:
        static_assert(std::is_same<decltype(close_string(string_opened)), void>::value, "$call{} requires void expression"); (close_string(string_opened));
        static_assert(std::is_same<decltype(call(segment._text)), void>::value, "$call{} requires void expression"); (call(segment._text));
          break;
        case segment_type::raw:
        static_assert(std::is_same<decltype(close_string(string_opened)), void>::value, "$call{} requires void expression"); (close_string(string_opened));
        static_assert(std::is_same<decltype(raw(segment._text)), void>::value, "$call{} requires void expression"); (raw(segment._text));
          break;
        }
      }
      if (not line._next_line_starts_with_text)
      {
      static_assert(std::is_same<decltype(close_string(string_opened)), void>::value, "$call{} requires void expression"); (close_string(string_opened));
      }
    _serialize.text("\n");
    }